

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O2

ostream * Eigen::internal::print_matrix<Eigen::Matrix<double,3,1,0,3,1>>
                    (ostream *s,Matrix<double,_3,_1,_0,_3,_1> *_m,IOFormat *fmt)

{
  ostream oVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  ostream oVar7;
  long lVar8;
  long lVar9;
  Index i;
  long lStack_230;
  undefined8 local_210;
  string local_1d8 [8];
  long local_1d0;
  stringstream sstr;
  
  iVar2 = fmt->precision;
  lVar8 = (long)iVar2;
  if (lVar8 == -2) {
    lVar8 = 0xf;
  }
  else {
    bVar5 = true;
    if ((iVar2 == -1) || (iVar2 == 0)) {
      local_210 = 0;
      goto LAB_00113b10;
    }
  }
  local_210 = *(undefined8 *)(s + *(long *)(*(long *)s + -0x18) + 8);
  *(long *)(s + *(long *)(*(long *)s + -0x18) + 8) = lVar8;
  bVar5 = false;
LAB_00113b10:
  if ((fmt->flags & 1) == 0) {
    bVar6 = true;
    lVar8 = 0;
    lStack_230 = 0;
    while (bVar6) {
      for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
        std::__cxx11::stringstream::stringstream((stringstream *)&sstr);
        std::ios::copyfmt((ios *)((stringstream *)&sstr + *(long *)(_sstr + -0x18)));
        std::ostream::_M_insert<double>
                  (*(double *)
                    ((long)(_m->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                           m_storage.m_data.array + lVar9 * 8 + lStack_230));
        std::__cxx11::stringbuf::str();
        if (lVar8 <= local_1d0) {
          lVar8 = local_1d0;
        }
        std::__cxx11::string::~string(local_1d8);
        std::__cxx11::stringstream::~stringstream((stringstream *)&sstr);
      }
      bVar6 = false;
      lStack_230 = 0x18;
    }
  }
  else {
    lVar8 = 0;
  }
  uVar3 = *(undefined8 *)(s + *(long *)(*(long *)s + -0x18) + 0x10);
  oVar7 = (ostream)std::ios::fill();
  std::operator<<(s,(string *)fmt);
  lVar9 = 0;
  do {
    if (lVar9 != 0) {
      if (lVar9 == 3) {
        std::operator<<(s,(string *)&fmt->matSuffix);
        if (!bVar5) {
          *(undefined8 *)(s + *(long *)(*(long *)s + -0x18) + 8) = local_210;
        }
        if (lVar8 != 0) {
          lVar8 = *(long *)(*(long *)s + -0x18);
          std::ios::fill();
          s[lVar8 + 0xe0] = oVar7;
          *(undefined8 *)(s + *(long *)(*(long *)s + -0x18) + 0x10) = uVar3;
        }
        return s;
      }
      std::operator<<(s,(string *)&fmt->rowSpacer);
    }
    std::operator<<(s,(string *)&fmt->rowPrefix);
    if (lVar8 != 0) {
      lVar4 = *(long *)(*(long *)s + -0x18);
      oVar1 = (ostream)fmt->fill;
      std::ios::fill();
      s[lVar4 + 0xe0] = oVar1;
      *(long *)(s + *(long *)(*(long *)s + -0x18) + 0x10) = lVar8;
    }
    std::ostream::_M_insert<double>
              ((_m->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
               array[lVar9]);
    std::operator<<(s,(string *)&fmt->rowSuffix);
    if (lVar9 != 2) {
      std::operator<<(s,(string *)&fmt->rowSeparator);
    }
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

std::ostream & print_matrix(std::ostream & s, const Derived& _m, const IOFormat& fmt)
{
  using internal::is_same;
  using internal::conditional;

  if(_m.size() == 0)
  {
    s << fmt.matPrefix << fmt.matSuffix;
    return s;
  }
  
  typename Derived::Nested m = _m;
  typedef typename Derived::Scalar Scalar;
  typedef typename
      conditional<
          is_same<Scalar, char>::value ||
            is_same<Scalar, unsigned char>::value ||
            is_same<Scalar, numext::int8_t>::value ||
            is_same<Scalar, numext::uint8_t>::value,
          int,
          typename conditional<
              is_same<Scalar, std::complex<char> >::value ||
                is_same<Scalar, std::complex<unsigned char> >::value ||
                is_same<Scalar, std::complex<numext::int8_t> >::value ||
                is_same<Scalar, std::complex<numext::uint8_t> >::value,
              std::complex<int>,
              const Scalar&
            >::type
        >::type PrintType;

  Index width = 0;

  std::streamsize explicit_precision;
  if(fmt.precision == StreamPrecision)
  {
    explicit_precision = 0;
  }
  else if(fmt.precision == FullPrecision)
  {
    if (NumTraits<Scalar>::IsInteger)
    {
      explicit_precision = 0;
    }
    else
    {
      explicit_precision = significant_decimals_impl<Scalar>::run();
    }
  }
  else
  {
    explicit_precision = fmt.precision;
  }

  std::streamsize old_precision = 0;
  if(explicit_precision) old_precision = s.precision(explicit_precision);

  bool align_cols = !(fmt.flags & DontAlignCols);
  if(align_cols)
  {
    // compute the largest width
    for(Index j = 0; j < m.cols(); ++j)
      for(Index i = 0; i < m.rows(); ++i)
      {
        std::stringstream sstr;
        sstr.copyfmt(s);
        sstr << static_cast<PrintType>(m.coeff(i,j));
        width = std::max<Index>(width, Index(sstr.str().length()));
      }
  }
  std::streamsize old_width = s.width();
  char old_fill_character = s.fill();
  s << fmt.matPrefix;
  for(Index i = 0; i < m.rows(); ++i)
  {
    if (i)
      s << fmt.rowSpacer;
    s << fmt.rowPrefix;
    if(width) {
      s.fill(fmt.fill);
      s.width(width);
    }
    s << static_cast<PrintType>(m.coeff(i, 0));
    for(Index j = 1; j < m.cols(); ++j)
    {
      s << fmt.coeffSeparator;
      if(width) {
        s.fill(fmt.fill);
        s.width(width);
      }
      s << static_cast<PrintType>(m.coeff(i, j));
    }
    s << fmt.rowSuffix;
    if( i < m.rows() - 1)
      s << fmt.rowSeparator;
  }
  s << fmt.matSuffix;
  if(explicit_precision) s.precision(old_precision);
  if(width) {
    s.fill(old_fill_character);
    s.width(old_width);
  }
  return s;
}